

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_data.cpp
# Opt level: O0

void __thiscall libtorrent::dht::find_data::start(find_data *this)

{
  node *pnVar1;
  bool bVar2;
  node_id *pnVar3;
  endpoint local_6c;
  reference local_50;
  node_entry *n;
  const_iterator __end3;
  const_iterator __begin3;
  vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_> *__range3;
  undefined1 local_28 [8];
  vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_> nodes;
  find_data *this_local;
  
  nodes.
  super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar2 = ::std::
          vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
          ::empty(&(this->super_traversal_algorithm).m_results);
  if (bVar2) {
    pnVar1 = (this->super_traversal_algorithm).m_node;
    pnVar3 = traversal_algorithm::target(&this->super_traversal_algorithm);
    routing_table::find_node
              ((vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_> *)
               local_28,&pnVar1->m_table,pnVar3,(find_nodes_flags_t)0x1,0);
    __end3 = ::std::
             vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>::
             begin((vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                    *)local_28);
    n = (node_entry *)
        ::std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>::
        end((vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_> *)
            local_28);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                                       *)&n), bVar2) {
      local_50 = __gnu_cxx::
                 __normal_iterator<const_libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
                 ::operator*(&__end3);
      pnVar3 = &local_50->id;
      node_entry::ep(&local_6c,local_50);
      traversal_algorithm::add_entry
                (&this->super_traversal_algorithm,pnVar3,&local_6c,(observer_flags_t)0x2);
      __gnu_cxx::
      __normal_iterator<const_libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
      ::operator++(&__end3);
    }
    ::std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>::
    ~vector((vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_> *)
            local_28);
  }
  traversal_algorithm::start(&this->super_traversal_algorithm);
  return;
}

Assistant:

void find_data::start()
{
	// if the user didn't add seed-nodes manually, grab k (bucket size)
	// nodes from routing table.
	if (m_results.empty())
	{
		std::vector<node_entry> const nodes = m_node.m_table.find_node(
			target(), routing_table::include_failed);

		for (auto const& n : nodes)
		{
			add_entry(n.id, n.ep(), observer::flag_initial);
		}
	}

	traversal_algorithm::start();
}